

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategyDriver.cpp
# Opt level: O1

int main(void)

{
  pointer ppPVar1;
  Player *pPVar2;
  string *psVar3;
  pointer pcVar4;
  char cVar5;
  GameLoop *pGVar6;
  ostream *poVar7;
  pointer ppPVar8;
  char choice;
  char local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_51 = '\0';
  GameLoop::startSingle(true);
  pGVar6 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "All players have been initialized. Do you want to make all players Humans?(y/n)",0x4f)
  ;
  std::operator>>((istream *)&std::cin,&local_51);
  cVar5 = local_51;
  pGVar6 = GameLoop::getInstance();
  ppPVar8 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar1 = (pGVar6->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (cVar5 == 'y') {
    if (ppPVar8 != ppPVar1) {
      do {
        pPVar2 = *ppPVar8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*pPVar2->pPlayerId);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," was ",5);
        psVar3 = pPVar2->strategy->strategyName;
        pcVar4 = (psVar3->_M_dataplus)._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + psVar3->_M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        Player::setPlayerStrategy(pPVar2,HUMAN_PLAYER);
        ppPVar8 = ppPVar8 + 1;
      } while (ppPVar8 != ppPVar1);
    }
  }
  else if (ppPVar8 != ppPVar1) {
    do {
      pPVar2 = *ppPVar8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*pPVar2->pPlayerId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," is ",4);
      psVar3 = pPVar2->strategy->strategyName;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + psVar3->_M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_50,local_48);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      ppPVar8 = ppPVar8 + 1;
    } while (ppPVar8 != ppPVar1);
  }
  pGVar6 = GameLoop::getInstance();
  GameLoop::loop(pGVar6,-1);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    char choice = '\0';
    GameLoop::startSingle(true);
    GameLoop::getInstance()->distributeArmies();


    std::cout << "All players have been initialized. Do you want to make all players Humans?(y/n)";
    std::cin >> choice;
    if(choice == 'y') {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " was " << p->getStrategy()->getStrategyName() << std::endl;
            p->setPlayerStrategy(Strategies::HUMAN_PLAYER);
        }
    } else {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " is " << p->getStrategy()->getStrategyName() << std::endl;
        }
    }

    GameLoop::getInstance()->loop();

    GameLoop::resetInstance();
    return 0;
}